

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O1

void __thiscall cppurses::Event_loop::run_async(Event_loop *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result<int> *p_Var4;
  _State_baseV2 *__tmp;
  bool bVar5;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  __state_type local_58;
  __basic_future<int> local_48;
  long *local_30;
  
  local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00166630;
  peVar1 = (element_type *)(p_Var3 + 1);
  p_Var3[2]._M_use_count = 0;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var3[1]._M_weak_count + 1) = 0;
  p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[3]._M_use_count = 0;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00166680;
  p_Var4 = (_Result<int> *)operator_new(0x18);
  std::__future_base::_Result<int>::_Result(p_Var4);
  p_Var3[4]._vptr__Sp_counted_base = (_func_int **)p_Var4;
  *(Event_loop **)&p_Var3[4]._M_use_count = this;
  local_48._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_30 = (long *)operator_new(0x20);
  *local_30 = (long)&PTR___State_001666d8;
  local_30[1] = (long)peVar1;
  local_30[2] = (long)std::__future_base::
                      _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/uspasojevic96[P]markdown-notes/external/CPPurses/src/system/event_loop.cpp:33:43)>_>,_int>
                      ::_M_run;
  local_30[3] = 0;
  std::thread::_M_start_thread(&local_48,&local_30,0);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  _Var2._M_pi = local_58.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (p_Var3[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
    p_Var3[3]._vptr__Sp_counted_base =
         (_func_int **)
         local_48._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar5 = local_58.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    if (bVar5) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
    }
    if (local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
      p_Var3->_M_use_count = 1;
      p_Var3->_M_weak_count = 1;
      p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00166718;
      p_Var3[2]._M_use_count = 0;
      p_Var3[1]._M_use_count = 0;
      p_Var3[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var3[1]._M_weak_count + 1) = 0;
      p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00166768;
      p_Var4 = (_Result<int> *)operator_new(0x18);
      std::__future_base::_Result<int>::_Result(p_Var4);
      _Var2._M_pi = local_58.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      p_Var3[3]._vptr__Sp_counted_base = (_func_int **)p_Var4;
      *(Event_loop **)&p_Var3[3]._M_use_count = this;
      bVar5 = local_58.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(p_Var3 + 1);
      local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if (bVar5) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
      }
    }
    std::__basic_future<int>::__basic_future(&local_48,&local_58);
    if (local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    _Var2._M_pi = local_48._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar1 = local_48._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_48._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (this->fut_).super___basic_future<int>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->fut_).super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (this->fut_).super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var2._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (local_48._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return;
  }
  std::terminate();
}

Assistant:

auto Event_loop::run_async() -> void
{
    fut_ = std::async(std::launch::async, [this] { return this->run(); });
}